

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.h
# Opt level: O2

vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
wasm::DFA::refinePartitions<std::__cxx11::string>
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,DFA *this,
          vector<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<wasm::DFA::State<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *partitions)

{
  __node_base_ptr *this_00;
  pointer puVar1;
  value_type *pvVar2;
  long *plVar3;
  key_type *pkVar4;
  uint __line;
  pointer pvVar5;
  pointer puVar6;
  iterator iVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  long *plVar8;
  key_type *__k;
  undefined1 auVar9 [8];
  char *__assertion;
  value_type *__x;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar10;
  undefined1 local_110 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  indices;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  indexPartitions;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 auStack_88 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> succIndices;
  undefined1 auStack_58 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  indexResults;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *results;
  
  local_110 = (undefined1  [8])&indices._M_h._M_rehash_policy._M_next_resize;
  indices._M_h._M_buckets = (__buckets_ptr)0x1;
  indices._M_h._M_bucket_count = 0;
  indices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indices._M_h._M_element_count._0_4_ = 0x3f800000;
  indices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  indices._M_h._M_rehash_policy._4_4_ = 0;
  indices._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_a8 = (undefined1  [8])0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar6 = *(pointer *)this;
  puVar1 = *(pointer *)(this + 8);
  this_00 = &indices._M_h._M_single_bucket;
  do {
    if (puVar6 == puVar1) {
      indices._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::reserve((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)&indices._M_h._M_single_bucket,(*(long *)(this + 8) - *(long *)this) / 0x18);
      plVar8 = *(long **)this;
      plVar3 = *(long **)(this + 8);
      do {
        if (plVar8 == plVar3) {
          wasm::DFA::Internal::refinePartitionsImpl((vector *)auStack_58);
          (__return_storage_ptr__->
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::reserve(__return_storage_ptr__,
                    ((long)indexResults.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) / 0x18);
          pvVar5 = indexResults.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (auVar9 = auStack_58; auVar9 != (undefined1  [8])pvVar5;
              auVar9 = (undefined1  [8])((long)auVar9 + 0x18)) {
            auStack_88 = (undefined1  [8])0x0;
            succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_88,
                      (long)(((pointer)auVar9)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(((pointer)auVar9)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3);
            puVar1 = (((pointer)auVar9)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar6 = (((pointer)auVar9)->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
            {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88,(value_type *)((long)auStack_a8 + *puVar6 * 0x20));
            }
            std::
            vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        *)__return_storage_ptr__,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_88);
          }
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)auStack_58);
          std::
          vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&indices._M_h._M_single_bucket);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_a8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_110);
          return __return_storage_ptr__;
        }
        indexResults.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_58 = (undefined1  [8])0x0;
        indexResults.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::reserve((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)auStack_58,(plVar8[1] - *plVar8) / 0x38);
        succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)plVar8[1];
        for (puVar6 = (pointer)*plVar8;
            puVar6 != succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage; puVar6 = puVar6 + 7) {
          auStack_88 = (undefined1  [8])0x0;
          succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                     (long)(puVar6[5] - puVar6[4]) >> 5);
          pkVar4 = (key_type *)puVar6[5];
          for (__k = (key_type *)puVar6[4]; __k != pkVar4; __k = __k + 1) {
            iVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_110,__k);
            if (iVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              __assertion = "it != indices.end() && \"unknown successor value\"";
              __line = 0x4b;
              goto LAB_0013899f;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                       (value_type_conflict1 *)
                       ((long)iVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                              ._M_cur + 0x28));
          }
          std::
          vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      *)auStack_58,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88);
        }
        std::
        vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
        ::
        emplace_back<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                  ((vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                    *)&indices._M_h._M_single_bucket,
                   (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)auStack_58);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)auStack_58);
        plVar8 = plVar8 + 3;
      } while( true );
    }
    pvVar2 = (value_type *)puVar6[1];
    succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6;
    for (__x = (value_type *)*puVar6; __x != pvVar2;
        __x = (value_type *)(__x[1].field_2._M_local_buf + 8)) {
      std::__cxx11::string::string((string *)this_00,(string *)__x);
      pVar10 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)local_110,this_00);
      std::__cxx11::string::~string((string *)this_00);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assertion = "inserted && \"unexpected repeated value\"";
        __line = 0x3b;
LAB_0013899f:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/dfa_minimization.h"
                      ,__line,
                      "std::vector<std::vector<T>> wasm::DFA::refinePartitions(const std::vector<std::vector<State<T>>> &) [T = std::basic_string<char>]"
                     );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_a8,__x);
    }
    puVar6 = succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 3;
  } while( true );
}

Assistant:

std::vector<std::vector<T>>
refinePartitions(const std::vector<std::vector<State<T>>>& partitions) {
  // Map values to indices and vice versa.
  std::unordered_map<T, size_t> indices;
  std::vector<T> values;
  for (const auto& partition : partitions) {
    for (const auto& state : partition) {
      [[maybe_unused]] bool inserted =
        indices.insert({state.val, indices.size()}).second;
      assert(inserted && "unexpected repeated value");
      values.push_back(state.val);
    }
  }

  // Create a copy of the DFA that uses indices instead of the original values.
  std::vector<std::vector<std::vector<size_t>>> indexPartitions;
  indexPartitions.reserve(partitions.size());
  for (const auto& partition : partitions) {
    std::vector<std::vector<size_t>> indexPartition;
    indexPartition.reserve(partition.size());
    for (const auto& state : partition) {
      std::vector<size_t> succIndices;
      succIndices.reserve(state.succs.size());
      for (const auto& succ : state.succs) {
        auto it = indices.find(succ);
        assert(it != indices.end() && "unknown successor value");
        succIndices.push_back(it->second);
      }
      indexPartition.emplace_back(std::move(succIndices));
    }
    indexPartitions.emplace_back(std::move(indexPartition));
  }

  // Refine the partitions.
  auto indexResults = Internal::refinePartitionsImpl(indexPartitions);

  // Map the refined partitions of indices back to values.
  std::vector<std::vector<T>> results;
  results.reserve(indexResults.size());
  for (const auto& indexPartition : indexResults) {
    std::vector<T> partition;
    partition.reserve(indexPartition.size());
    for (size_t index : indexPartition) {
      partition.push_back(values[index]);
    }
    results.emplace_back(std::move(partition));
  }

  return results;
}